

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O1

qsizetype __thiscall
QDecompressHelper::readInternal(QDecompressHelper *this,char *data,qsizetype maxSize)

{
  ContentEncoding CVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  bool bVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  QArrayData *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((maxSize < 1) ||
     (((this->compressedDataBuffer).bufferCompleteSize == 0 && ((this->decoderHasData & 1U) == 0))))
  {
    qVar5 = 0;
  }
  else {
    CVar1 = this->contentEncoding;
    if (CVar1 - Deflate < 2) {
      qVar5 = readZLib(this,data,maxSize);
    }
    else if (CVar1 == Brotli) {
      qVar5 = readBrotli(this,data,maxSize);
    }
    else {
      qVar5 = -1;
      if (CVar1 == Zstandard) {
        qVar5 = readZstandard(this,data,maxSize);
      }
    }
    if (qVar5 == -1) {
      clear(this);
    }
    this->totalUncompressedBytes = this->totalUncompressedBytes + qVar5;
    bVar4 = isPotentialArchiveBomb(this);
    if (bVar4) {
      QCoreApplication::translate
                ((char *)&local_38,"QHttp",
                 "The decompressed output exceeds the limits specified by QNetworkRequest::decompressedSafetyCheckThreshold()"
                 ,0);
      pQVar2 = &((this->errorStr).d.d)->super_QArrayData;
      pcVar3 = (this->errorStr).d.ptr;
      (this->errorStr).d.d = (Data *)local_38;
      (this->errorStr).d.ptr = pcStack_30;
      qVar5 = (this->errorStr).d.size;
      (this->errorStr).d.size = local_28;
      local_38 = pQVar2;
      pcStack_30 = pcVar3;
      local_28 = qVar5;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
      qVar5 = -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return qVar5;
}

Assistant:

qsizetype QDecompressHelper::readInternal(char *data, qsizetype maxSize)
{
    Q_ASSERT(isValid());

    if (maxSize <= 0)
        return 0;

    if (!hasDataInternal())
        return 0;

    qsizetype bytesRead = -1;
    switch (contentEncoding) {
    case None:
        Q_UNREACHABLE();
        break;
    case Deflate:
    case GZip:
        bytesRead = readZLib(data, maxSize);
        break;
    case Brotli:
        bytesRead = readBrotli(data, maxSize);
        break;
    case Zstandard:
        bytesRead = readZstandard(data, maxSize);
        break;
    }
    if (bytesRead == -1)
        clear();

    totalUncompressedBytes += bytesRead;
    if (isPotentialArchiveBomb()) {
        errorStr = QCoreApplication::translate(
                "QHttp",
                "The decompressed output exceeds the limits specified by "
                "QNetworkRequest::decompressedSafetyCheckThreshold()");
        return -1;
    }

    return bytesRead;
}